

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O0

void Glucose_CheckTwoNodesTest(Gia_Man_t *p)

{
  int iVar1;
  int iLit1;
  bmcg_sat_solver *s;
  Gia_Obj_t *pGVar2;
  char *pcVar3;
  char *local_58;
  bmcg_sat_solver *pSat;
  int Res;
  int n;
  Gia_Man_t *p_local;
  
  s = bmcg_sat_solver_start();
  for (pSat._4_4_ = 0; pSat._4_4_ < 2; pSat._4_4_ = pSat._4_4_ + 1) {
    pGVar2 = Gia_ManPo(p,0);
    iVar1 = Gia_ObjFaninLit0p(p,pGVar2);
    pGVar2 = Gia_ManPo(p,1);
    iLit1 = Gia_ObjFaninLit0p(p,pGVar2);
    iVar1 = bmcg_sat_solver_equiv_overlap_check(s,p,iVar1,iLit1,pSat._4_4_);
    bmcg_sat_solver_reset(s);
    pcVar3 = "Overlap";
    if (pSat._4_4_ != 0) {
      pcVar3 = "Equivalence";
    }
    if (iVar1 == 0) {
      local_58 = "fails";
    }
    else {
      local_58 = "holds";
    }
    printf("%s %s.\n",pcVar3,local_58);
  }
  bmcg_sat_solver_stop(s);
  return;
}

Assistant:

void Glucose_CheckTwoNodesTest( Gia_Man_t * p )
{
    int n, Res;
    bmcg_sat_solver * pSat = bmcg_sat_solver_start();
    for ( n = 0; n < 2; n++ )
    {
        Res = bmcg_sat_solver_equiv_overlap_check( 
            pSat, p, 
            Gia_ObjFaninLit0p(p, Gia_ManPo(p, 0)), 
            Gia_ObjFaninLit0p(p, Gia_ManPo(p, 1)), 
            n );
        bmcg_sat_solver_reset( pSat );
        printf( "%s %s.\n", n ? "Equivalence" : "Overlap", Res ? "holds" : "fails" );
    }
    bmcg_sat_solver_stop( pSat );
}